

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void Abc_FlowRetime_FreeTiming(Abc_Ntk_t *pNtk)

{
  void **__ptr;
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  
  while (pVVar2 = pManMR->vExactNodes, pVVar2->nSize != 0) {
    pvVar1 = Vec_PtrPop(pVVar2);
    if (pManMR->vTimeEdges[*(uint *)((long)pvVar1 + 0x10)].nSize != 0) {
      pVVar2 = pManMR->vTimeEdges + *(uint *)((long)pvVar1 + 0x10);
      __ptr = pVVar2->pArray;
      pVVar2->nCap = 0;
      pVVar2->nSize = 0;
      pVVar2->pArray = (void **)0x0;
      free(__ptr);
    }
  }
  free(pVVar2->pArray);
  free(pVVar2);
  if (pManMR->vTimeEdges != (Vec_Ptr_t *)0x0) {
    free(pManMR->vTimeEdges);
    pManMR->vTimeEdges = (Vec_Ptr_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FlowRetime_FreeTiming( Abc_Ntk_t *pNtk ) {
  Abc_Obj_t *pObj;
  void *pArray;

  while( Vec_PtrSize( pManMR->vExactNodes )) {
    pObj = (Abc_Obj_t*)Vec_PtrPop( pManMR->vExactNodes );
    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  }

  Vec_PtrFree(pManMR->vExactNodes);
  ABC_FREE( pManMR->vTimeEdges );
}